

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int birthday_cdf_inv(double cdf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar1 = 0;
  if ((0.0 < cdf) && (iVar1 = 0x16d, cdf < 1.0)) {
    iVar2 = 1;
    iVar3 = 0x16d;
    dVar4 = 1.0;
    while ((iVar1 = 0x16d, iVar2 != 0x16e &&
           (dVar4 = (dVar4 * (double)iVar3) / 365.0, iVar1 = iVar2, 1.0 - dVar4 < cdf))) {
      iVar2 = iVar2 + 1;
      iVar3 = iVar3 + -1;
    }
  }
  return iVar1;
}

Assistant:

int birthday_cdf_inv ( double cdf )

//****************************************************************************80
//
//  Purpose:
//
//    BIRTHDAY_CDF_INV inverts the Birthday Concurrence CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the probability that at least
//    two of the N people have matching birthays..
//
//    Output, int BIRTHDAY_CDF_INV, the corresponding number of people whose
//    birthdays need to be disclosed.
//
{
  double cdf_not;
  int i;
  int n;

  if ( cdf <= 0.0 )
  {
    n = 0;
    return n;
  }
  else if ( 1.0 <= cdf )
  {
    n = 365;
    return n;
  }
//
//  Compute the probability that N people have distinct birthdays.
//
  cdf_not = 1.0;

  for ( i = 1; i <= 365; i++ )
  {
    cdf_not = cdf_not * static_cast<double>(365 + 1 - i ) / 365.0;
    if ( cdf <= 1.0 - cdf_not )
    {
      n = i;
      return n;
    }
  }
  n = 365;
  return n;
}